

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderIntegerMixTests.cpp
# Opt level: O0

qpTestResult __thiscall deqp::ShaderIntegerMixDefineCase::test(ShaderIntegerMixDefineCase *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  ContextInfo *this_00;
  char *pcVar6;
  mapped_type *pmVar7;
  GLSLVersion version;
  int local_134;
  undefined8 uStack_130;
  GLint compileSuccess;
  char *strings [1];
  GLuint shader;
  StringTemplate local_100;
  undefined1 local_e0 [8];
  string code;
  key_type local_b8;
  allocator<char> local_91;
  key_type local_90;
  undefined1 local_60 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  args;
  int i;
  GLSLVersion v;
  bool pass;
  Functions *gl;
  ShaderIntegerMixDefineCase *this_local;
  long lVar5;
  
  pRVar4 = deqp::Context::getRenderContext
                     ((this->super_ShaderIntegerMixCase).super_TestCase.m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var,iVar3);
  bVar1 = true;
  bVar2 = glu::glslVersionIsES((this->super_ShaderIntegerMixCase).m_glslVersion);
  version = GLSL_VERSION_330;
  if (bVar2) {
    version = GLSL_VERSION_300_ES;
  }
  this_00 = deqp::Context::getContextInfo
                      ((this->super_ShaderIntegerMixCase).super_TestCase.m_context);
  bVar2 = glu::ContextInfo::isExtensionSupported(this_00,"GL_EXT_shader_integer_mix");
  if (bVar2) {
    for (args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0;
        args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ < 2;
        args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 1) {
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_60);
      pcVar6 = glu::getGLSLVersionDeclaration(version);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"VERSION_DECL",&local_91);
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_60,&local_90);
      std::__cxx11::string::operator=((string *)pmVar7,pcVar6);
      std::__cxx11::string::~string((string *)&local_90);
      std::allocator<char>::~allocator(&local_91);
      pcVar6 = test::shader_targets[args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_].
               body;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"BODY",(allocator<char> *)(code.field_2._M_local_buf + 0xf));
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)local_60,&local_b8);
      std::__cxx11::string::operator=((string *)pmVar7,pcVar6);
      std::__cxx11::string::~string((string *)&local_b8);
      std::allocator<char>::~allocator((allocator<char> *)(code.field_2._M_local_buf + 0xf));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&shader,
                 "${VERSION_DECL}\n#extension GL_EXT_shader_integer_mix: require\n\n#if !defined GL_EXT_shader_integer_mix\n#  error GL_EXT_shader_integer_mix is not defined\n#elif GL_EXT_shader_integer_mix != 1\n#  error GL_EXT_shader_integer_mix is not equal to 1\n#endif\n\nvoid main(void) { ${BODY} }\n"
                 ,(allocator<char> *)((long)strings + 7));
      tcu::StringTemplate::StringTemplate(&local_100,(string *)&shader);
      tcu::StringTemplate::specialize
                ((string *)local_e0,&local_100,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_60);
      tcu::StringTemplate::~StringTemplate(&local_100);
      std::__cxx11::string::~string((string *)&shader);
      std::allocator<char>::~allocator((allocator<char> *)((long)strings + 7));
      strings[0]._0_4_ =
           (**(code **)(lVar5 + 0x3f0))
                     (test::shader_targets
                      [args._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_].target);
      uStack_130 = std::__cxx11::string::c_str();
      (**(code **)(lVar5 + 0x12b8))(strings[0]._0_4_,1,&stack0xfffffffffffffed0);
      (**(code **)(lVar5 + 0x248))(strings[0]._0_4_);
      local_134 = 0;
      (**(code **)(lVar5 + 0xa70))(strings[0]._0_4_,0x8b81,&local_134);
      (**(code **)(lVar5 + 0x470))(strings[0]._0_4_);
      if (local_134 == 0) {
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)local_e0);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_60);
    }
    this_local._4_4_ = (qpTestResult)!bVar1;
  }
  else {
    this_local._4_4_ = QP_TEST_RESULT_NOT_SUPPORTED;
  }
  return this_local._4_4_;
}

Assistant:

virtual qpTestResult test()
	{
		const glw::Functions& gl   = m_context.getRenderContext().getFunctions();
		bool				  pass = true;

		static const char source_template[] = "${VERSION_DECL}\n"
											  "#extension GL_EXT_shader_integer_mix: require\n"
											  "\n"
											  "#if !defined GL_EXT_shader_integer_mix\n"
											  "#  error GL_EXT_shader_integer_mix is not defined\n"
											  "#elif GL_EXT_shader_integer_mix != 1\n"
											  "#  error GL_EXT_shader_integer_mix is not equal to 1\n"
											  "#endif\n"
											  "\n"
											  "void main(void) { ${BODY} }\n";

		static const struct
		{
			GLenum		target;
			const char* body;
		} shader_targets[] = {
			{ GL_VERTEX_SHADER, "gl_Position = vec4(0);" }, { GL_FRAGMENT_SHADER, "" },
		};

		const glu::GLSLVersion v = glslVersionIsES(m_glslVersion) ? glu::GLSL_VERSION_300_ES : glu::GLSL_VERSION_330;

		if (!m_context.getContextInfo().isExtensionSupported("GL_EXT_shader_integer_mix"))
			return QP_TEST_RESULT_NOT_SUPPORTED;

		for (int i = 0; i < DE_LENGTH_OF_ARRAY(shader_targets); i++)
		{
			std::map<std::string, std::string> args;

			args["VERSION_DECL"] = glu::getGLSLVersionDeclaration(v);
			args["BODY"]		 = shader_targets[i].body;

			std::string code = tcu::StringTemplate(source_template).specialize(args);

			GLuint		shader	 = gl.createShader(shader_targets[i].target);
			char const* strings[1] = { code.c_str() };
			gl.shaderSource(shader, 1, strings, 0);
			gl.compileShader(shader);

			GLint compileSuccess = 0;
			gl.getShaderiv(shader, GL_COMPILE_STATUS, &compileSuccess);
			gl.deleteShader(shader);

			if (!compileSuccess)
				pass = false;
		}

		return pass ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL;
	}